

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi_loadf_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  float *pfVar1;
  stbi__context s;
  stbi__context sStack_108;
  
  sStack_108.img_buffer = sStack_108.buffer_start;
  sStack_108.io.eof = stbi__stdio_eof;
  sStack_108.io.read = stbi__stdio_read;
  sStack_108.io.skip = stbi__stdio_skip;
  sStack_108.read_from_callbacks = 1;
  sStack_108.buflen = 0x80;
  sStack_108.callback_already_read = 0;
  sStack_108.io_user_data = f;
  sStack_108.img_buffer_original = sStack_108.img_buffer;
  stbi__refill_buffer(&sStack_108);
  sStack_108.img_buffer_original_end = sStack_108.img_buffer_end;
  pfVar1 = stbi__loadf_main(&sStack_108,x,y,comp,req_comp);
  return pfVar1;
}

Assistant:

STBIDEF float *stbi_loadf_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_file(&s,f);
   return stbi__loadf_main(&s,x,y,comp,req_comp);
}